

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::ATan2,bool,false,true>
               (double *ldata,double *rdata,double *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar9 = *rdata;
      iVar4 = 0;
      do {
        dVar8 = atan2(ldata[iVar4],dVar9);
        result_data[iVar4] = dVar8;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar2 = 0;
    uVar6 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = 0xffffffffffffffff;
      }
      else {
        uVar3 = puVar1[uVar2];
      }
      uVar5 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar5 = count;
      }
      uVar7 = uVar5;
      if (uVar3 != 0) {
        uVar7 = uVar6;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar6 < uVar5) {
            dVar9 = *rdata;
            do {
              dVar8 = atan2(ldata[uVar6],dVar9);
              result_data[uVar6] = dVar8;
              uVar6 = uVar6 + 1;
              uVar7 = uVar6;
            } while (uVar5 != uVar6);
          }
        }
        else if (uVar6 < uVar5) {
          uVar7 = 0;
          do {
            if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
              dVar9 = atan2(ldata[uVar6 + uVar7],*rdata);
              result_data[uVar6 + uVar7] = dVar9;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar6 - uVar5) + uVar7 != 0);
          uVar7 = uVar6 + uVar7;
        }
      }
      uVar2 = uVar2 + 1;
      uVar6 = uVar7;
    } while (uVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}